

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_ecc.c
# Opt level: O3

void tc_uECC_vli_mult(tc_uECC_word_t *result,tc_uECC_word_t *left,tc_uECC_word_t *right,
                     wordcount_t num_words)

{
  int iVar1;
  ulong uVar2;
  wordcount_t wVar3;
  char cVar4;
  tc_uECC_word_t *ptVar5;
  ulong uVar6;
  char cVar7;
  long lVar8;
  tc_uECC_word_t tVar9;
  long lVar10;
  uint *puVar11;
  ulong uVar12;
  ulong uVar13;
  
  if (num_words < '\x01') {
    uVar12 = 0;
    uVar2 = 0;
  }
  else {
    uVar6 = 0;
    lVar8 = 1;
    uVar13 = 0;
    ptVar5 = right;
    uVar2 = 0;
    do {
      uVar12 = uVar2;
      lVar10 = 0;
      uVar2 = 0;
      puVar11 = ptVar5;
      do {
        uVar12 = uVar13 & 0xffffffff | uVar12 << 0x20;
        uVar13 = uVar12 + (ulong)*puVar11 * (ulong)left[lVar10];
        uVar2 = (ulong)((int)uVar2 + (uint)CARRY8(uVar12,(ulong)*puVar11 * (ulong)left[lVar10]));
        uVar12 = uVar13 >> 0x20;
        lVar10 = lVar10 + 1;
        puVar11 = puVar11 + -1;
      } while (lVar8 != lVar10);
      result[uVar6] = (tc_uECC_word_t)uVar13;
      uVar6 = uVar6 + 1;
      lVar8 = lVar8 + 1;
      ptVar5 = ptVar5 + 1;
      uVar13 = uVar12;
    } while (uVar6 != (byte)num_words);
  }
  iVar1 = num_words * 2 + -1;
  if (num_words < iVar1) {
    cVar7 = '\x01';
    wVar3 = num_words;
    do {
      cVar4 = wVar3 + '\x01';
      uVar13 = 0;
      if ((char)(cVar4 - num_words) < num_words) {
        lVar8 = (long)cVar7;
        puVar11 = right + (wVar3 - lVar8);
        uVar13 = 0;
        do {
          uVar2 = uVar12 & 0xffffffff | uVar2 << 0x20;
          uVar12 = uVar2 + (ulong)*puVar11 * (ulong)left[lVar8];
          uVar13 = (ulong)((int)uVar13 + (uint)CARRY8(uVar2,(ulong)*puVar11 * (ulong)left[lVar8]));
          uVar2 = uVar12 >> 0x20;
          lVar8 = lVar8 + 1;
          puVar11 = puVar11 + -1;
        } while (lVar8 < num_words);
      }
      tVar9 = (tc_uECC_word_t)uVar2;
      result[wVar3] = (tc_uECC_word_t)uVar12;
      cVar7 = cVar7 + '\x01';
      uVar12 = uVar2;
      uVar2 = uVar13;
      wVar3 = cVar4;
    } while (cVar4 < iVar1);
  }
  else {
    tVar9 = (tc_uECC_word_t)uVar12;
  }
  result[iVar1] = tVar9;
  return;
}

Assistant:

static void tc_uECC_vli_mult(tc_uECC_word_t *result, const tc_uECC_word_t *left,
			  const tc_uECC_word_t *right, wordcount_t num_words)
{

	tc_uECC_word_t r0 = 0;
	tc_uECC_word_t r1 = 0;
	tc_uECC_word_t r2 = 0;
	wordcount_t i, k;

	/* Compute each digit of result in sequence, maintaining the carries. */
	for (k = 0; k < num_words; ++k) {

		for (i = 0; i <= k; ++i) {
			muladd(left[i], right[k - i], &r0, &r1, &r2);
		}

		result[k] = r0;
		r0 = r1;
		r1 = r2;
		r2 = 0;
	}

	for (k = num_words; k < num_words * 2 - 1; ++k) {

		for (i = (k + 1) - num_words; i < num_words; ++i) {
			muladd(left[i], right[k - i], &r0, &r1, &r2);
		}
		result[k] = r0;
		r0 = r1;
		r1 = r2;
		r2 = 0;
	}
	result[num_words * 2 - 1] = r0;
}